

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPAT.cpp
# Opt level: O2

void __thiscall OpenMD::NPAT::NPAT(NPAT *this,SimInfo *info)

{
  bool bVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  NPT::NPT(&this->super_NPT,info);
  (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NPAT_002bd740;
  SquareMatrix<double,_3>::SquareMatrix(&(this->eta).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->oldEta_).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->prevEta_).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->vScale_).super_SquareMatrix<double,_3>);
  pbVar3 = &(((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_)->simParams_->
            PrivilegedAxis).data_;
  std::__cxx11::string::string((string *)&local_40,(string *)pbVar3);
  bVar1 = std::operator==(&local_40,"x");
  std::__cxx11::string::~string((string *)&local_40);
  uVar2 = 0;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_40,(string *)pbVar3);
    bVar1 = std::operator==(&local_40,"y");
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      uVar2 = 1;
    }
    else {
      std::__cxx11::string::string((string *)&local_40,(string *)pbVar3);
      bVar1 = std::operator==(&local_40,"z");
      std::__cxx11::string::~string((string *)&local_40);
      if (!bVar1) {
        return;
      }
      uVar2 = 2;
    }
  }
  this->axis_ = uVar2;
  return;
}

Assistant:

NPAT::NPAT(SimInfo* info) : NPT(info) {
    Globals* simParams = info_->getSimParams();

    // Default value of privilegedAxis is "z"
    if (simParams->getPrivilegedAxis() == "x")
      axis_ = 0;
    else if (simParams->getPrivilegedAxis() == "y")
      axis_ = 1;
    else if (simParams->getPrivilegedAxis() == "z")
      axis_ = 2;
  }